

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_154c25e::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined4 uVar4;
  pointer pBVar5;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar6;
  pointer pBVar7;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> frag;
  ValueHolder local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined4 local_168;
  undefined1 local_160 [40];
  undefined1 local_138 [32];
  string frameworkPath;
  string linkLanguageFlags;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  __node_base local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  __buckets_ptr local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkLibs;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkPath;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkFlags;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  paVar1 = &linkLanguageFlags.field_2;
  linkLanguageFlags._M_string_length = 0;
  linkLanguageFlags.field_2._M_allocated_capacity._0_4_ =
       linkLanguageFlags.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_allocated_capacity._0_4_ =
       frameworkPath.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkLanguageFlags._M_dataplus._M_p = (pointer)paVar1;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  pcVar6 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_188,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&frag,(cmStateSnapshot *)&local_188);
  (*pcVar6->_vptr_cmGlobalGenerator[0x12])(&linkLineComputer,pcVar6,this_00,&frag);
  local_c8._M_nxt = (_Hash_node_base *)&linkLibs;
  cmLocalGenerator::GetTargetFlags
            (this_00,(cmLinkLineComputer *)
                     linkLineComputer._M_t.
                     super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                     .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl,this->Config,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_c8._M_nxt,&linkLanguageFlags,&linkFlags,&frameworkPath,&linkPath,this->GT);
  str._M_str = linkLanguageFlags._M_dataplus._M_p;
  str._M_len = linkLanguageFlags._M_string_length;
  cmTrimWhitespace_abi_cxx11_(&frag.Value,str);
  std::__cxx11::string::operator=((string *)&linkLanguageFlags,(string *)&frag);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
    operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
  }
  str_00._M_str = frameworkPath._M_dataplus._M_p;
  str_00._M_len = frameworkPath._M_string_length;
  cmTrimWhitespace_abi_cxx11_(&frag.Value,str_00);
  std::__cxx11::string::operator=((string *)&frameworkPath,(string *)&frag);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
    operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
  }
  uVar4 = linkLanguageFlags.field_2._M_allocated_capacity._0_4_;
  sVar3 = linkLanguageFlags._M_string_length;
  if (linkLanguageFlags._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguageFlags._M_dataplus._M_p == paVar1) {
      local_98._8_4_ = linkLanguageFlags.field_2._8_4_;
      local_98._12_4_ = linkLanguageFlags.field_2._12_4_;
      local_a8 = &local_98;
    }
    else {
      local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)linkLanguageFlags._M_dataplus._M_p;
    }
    local_98._M_allocated_capacity._4_4_ = linkLanguageFlags.field_2._M_allocated_capacity._4_4_;
    local_98._M_allocated_capacity._0_4_ = linkLanguageFlags.field_2._M_allocated_capacity._0_4_;
    linkLanguageFlags._M_string_length = 0;
    linkLanguageFlags.field_2._M_allocated_capacity._0_4_ =
         linkLanguageFlags.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    if (local_a8 == &local_98) {
      local_178._M_allocated_capacity =
           CONCAT44(linkLanguageFlags.field_2._M_allocated_capacity._4_4_,uVar4);
      local_178._8_4_ = local_98._8_4_;
      local_178._12_4_ = local_98._12_4_;
      local_c8._M_nxt = (_Hash_node_base *)local_a8;
      local_188.string_ = (char *)&local_178;
    }
    else {
      local_188.map_ = (ObjectValues *)local_a8;
      local_178._M_allocated_capacity = local_98._M_allocated_capacity;
      local_c8._M_nxt = (_Hash_node_base *)local_98._M_allocated_capacity;
    }
    local_180 = sVar3;
    local_a0 = (__buckets_ptr)0x0;
    local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
    local_168 = 0xffffffff;
    local_160._0_8_ = local_160 + 0x10;
    linkLanguageFlags._M_dataplus._M_p = (pointer)paVar1;
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"flags","");
    DumpCommandFragment((Value *)&frag,(Target *)&local_188,
                        (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_160,(string *)local_c8._M_nxt);
    Json::Value::append(__return_storage_ptr__,(Value *)&frag);
    Json::Value::~Value((Value *)&frag);
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188.string_,(ulong)(local_178._M_allocated_capacity + 1));
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98._M_allocated_capacity + 1);
    }
  }
  pBVar5 = linkFlags.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkFlags.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkFlags.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar7 = linkFlags.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      frag.Value._M_dataplus._M_p = (pointer)&frag.Value.field_2;
      pcVar2 = (pBVar7->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&frag,pcVar2,pcVar2 + (pBVar7->Value)._M_string_length);
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8._M_nxt = (_Hash_node_base *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      str_01._M_str = frag.Value._M_dataplus._M_p;
      str_01._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_188,str_01);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_188.bool_);
      if (local_188 != &local_178) {
        operator_delete(local_188.string_,(ulong)(local_178._M_allocated_capacity + 1));
      }
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,this,&frag);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"flags","");
      DumpCommandFragment((Value *)&local_188,(Target *)local_160,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138,(string *)local_c8._M_nxt);
      Json::Value::append(__return_storage_ptr__,(Value *)&local_188);
      Json::Value::~Value((Value *)&local_188);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
        operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar5);
  }
  uVar4 = frameworkPath.field_2._M_allocated_capacity._0_4_;
  sVar3 = frameworkPath._M_string_length;
  if (frameworkPath._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p == &frameworkPath.field_2) {
      local_b8._8_4_ = frameworkPath.field_2._8_4_;
      local_b8._12_4_ = frameworkPath.field_2._12_4_;
      local_c8._M_nxt = (_Hash_node_base *)&local_b8;
    }
    else {
      local_c8._M_nxt = (_Hash_node_base *)frameworkPath._M_dataplus._M_p;
    }
    local_b8._M_allocated_capacity._4_4_ = frameworkPath.field_2._M_allocated_capacity._4_4_;
    local_b8._M_allocated_capacity._0_4_ = frameworkPath.field_2._M_allocated_capacity._0_4_;
    frameworkPath._M_string_length = 0;
    frameworkPath.field_2._M_allocated_capacity._0_4_ =
         frameworkPath.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_nxt == &local_b8) {
      local_178._M_allocated_capacity =
           CONCAT44(frameworkPath.field_2._M_allocated_capacity._4_4_,uVar4);
      local_178._8_4_ = local_b8._8_4_;
      local_178._12_4_ = local_b8._12_4_;
      local_188.string_ = (char *)&local_178;
    }
    else {
      local_188.map_ = (ObjectValues *)local_c8._M_nxt;
      local_178._M_allocated_capacity = local_b8._M_allocated_capacity;
      local_c8._M_nxt = (_Hash_node_base *)local_b8._M_allocated_capacity;
    }
    local_180 = sVar3;
    local_b8._M_allocated_capacity = local_b8._M_allocated_capacity & 0xffffffffffffff00;
    local_168 = 0xffffffff;
    local_160._0_8_ = local_160 + 0x10;
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"frameworkPath","");
    DumpCommandFragment((Value *)&frag,(Target *)&local_188,
                        (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_160,(string *)local_c8._M_nxt);
    Json::Value::append(__return_storage_ptr__,(Value *)&frag);
    Json::Value::~Value((Value *)&frag);
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188.string_,(ulong)(local_178._M_allocated_capacity + 1));
    }
  }
  pBVar5 = linkPath.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkPath.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkPath.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar7 = linkPath.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      frag.Value._M_dataplus._M_p = (pointer)&frag.Value.field_2;
      pcVar2 = (pBVar7->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&frag,pcVar2,pcVar2 + (pBVar7->Value)._M_string_length);
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8._M_nxt = (_Hash_node_base *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      str_02._M_str = frag.Value._M_dataplus._M_p;
      str_02._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_188,str_02);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_188.bool_);
      if (local_188 != &local_178) {
        operator_delete(local_188.string_,(ulong)(local_178._M_allocated_capacity + 1));
      }
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,this,&frag);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"libraryPath","");
      DumpCommandFragment((Value *)&local_188,(Target *)local_160,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138,(string *)local_c8._M_nxt);
      Json::Value::append(__return_storage_ptr__,(Value *)&local_188);
      Json::Value::~Value((Value *)&local_188);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
        operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar5);
  }
  pBVar5 = linkLibs.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkLibs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkLibs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar7 = linkLibs.
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      frag.Value._M_dataplus._M_p = (pointer)&frag.Value.field_2;
      pcVar2 = (pBVar7->Value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&frag,pcVar2,pcVar2 + (pBVar7->Value)._M_string_length);
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (pBVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8._M_nxt = (_Hash_node_base *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      str_03._M_str = frag.Value._M_dataplus._M_p;
      str_03._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_188,str_03);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_188.bool_);
      if (local_188 != &local_178) {
        operator_delete(local_188.string_,(ulong)(local_178._M_allocated_capacity + 1));
      }
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,this,&frag);
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"libraries","");
      DumpCommandFragment((Value *)&local_188,(Target *)local_160,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_138,(string *)local_c8._M_nxt);
      Json::Value::append(__return_storage_ptr__,(Value *)&local_188);
      Json::Value::~Value((Value *)&local_188);
      if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
      if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      if (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (frag.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)frag.Value._M_dataplus._M_p != &frag.Value.field_2) {
        operator_delete(frag.Value._M_dataplus._M_p,frag.Value.field_2._M_allocated_capacity + 1);
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar5);
  }
  if ((__uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>)
      linkLineComputer._M_t.
      super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>._M_t.
      super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>.
      super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>)0x0) {
    (**(code **)(*(long *)linkLineComputer._M_t.
                          super___uniq_ptr_impl<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLinkLineComputer_*,_std::default_delete<cmLinkLineComputer>_>
                          .super__Head_base<0UL,_cmLinkLineComputer_*,_false>._M_head_impl + 8))();
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkLibs);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkPath);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT44(frameworkPath.field_2._M_allocated_capacity._4_4_,
                             frameworkPath.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkFlags);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkLanguageFlags._M_dataplus._M_p != &linkLanguageFlags.field_2) {
    operator_delete(linkLanguageFlags._M_dataplus._M_p,
                    CONCAT44(linkLanguageFlags.field_2._M_allocated_capacity._4_4_,
                             linkLanguageFlags.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::vector<BT<std::string>> linkFlags;
  std::string frameworkPath;
  std::vector<BT<std::string>> linkPath;
  std::vector<BT<std::string>> linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmGlobalGenerator* gg = this->GT->GetGlobalGenerator();
  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    gg->CreateLinkLineComputer(lg, lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(linkLineComputer.get(), this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmTrimWhitespace(linkLanguageFlags);
  frameworkPath = cmTrimWhitespace(frameworkPath);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    for (BT<std::string> frag : linkFlags) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "flags"));
    }
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    for (BT<std::string> frag : linkPath) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "libraryPath"));
    }
  }

  if (!linkLibs.empty()) {
    for (BT<std::string> frag : linkLibs) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "libraries"));
    }
  }

  return linkFragments;
}